

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegexpPtr xmlRegexpCompile(xmlChar *regexp)

{
  xmlRegParserCtxtPtr ctxt_00;
  xmlRegStatePtr pxVar1;
  xmlRegParserCtxtPtr ctxt;
  xmlRegexpPtr ret;
  xmlChar *regexp_local;
  
  ctxt_00 = xmlRegNewParserCtxt(regexp);
  if (ctxt_00 == (xmlRegParserCtxtPtr)0x0) {
    regexp_local = (xmlChar *)0x0;
  }
  else {
    ctxt_00->end = (xmlRegStatePtr)0x0;
    pxVar1 = xmlRegNewState(ctxt_00);
    ctxt_00->state = pxVar1;
    ctxt_00->start = pxVar1;
    xmlRegStatePush(ctxt_00,ctxt_00->start);
    xmlFAParseRegExp(ctxt_00,1);
    if (*ctxt_00->cur != '\0') {
      ctxt_00->error = 0x5aa;
      xmlRegexpErrCompile(ctxt_00,"xmlFAParseRegExp: extra characters");
    }
    if (ctxt_00->error == 0) {
      ctxt_00->end = ctxt_00->state;
      ctxt_00->start->type = XML_REGEXP_START_STATE;
      ctxt_00->end->type = XML_REGEXP_FINAL_STATE;
      xmlFAEliminateEpsilonTransitions(ctxt_00);
      if (ctxt_00->error == 0) {
        regexp_local = (xmlChar *)xmlRegEpxFromParse(ctxt_00);
        xmlRegFreeParserCtxt(ctxt_00);
      }
      else {
        xmlRegFreeParserCtxt(ctxt_00);
        regexp_local = (xmlChar *)0x0;
      }
    }
    else {
      xmlRegFreeParserCtxt(ctxt_00);
      regexp_local = (xmlChar *)0x0;
    }
  }
  return (xmlRegexpPtr)regexp_local;
}

Assistant:

xmlRegexpPtr
xmlRegexpCompile(const xmlChar *regexp) {
    xmlRegexpPtr ret;
    xmlRegParserCtxtPtr ctxt;

    ctxt = xmlRegNewParserCtxt(regexp);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->end = NULL;
    ctxt->start = ctxt->state = xmlRegNewState(ctxt);
    xmlRegStatePush(ctxt, ctxt->start);

    /* parse the expression building an automata */
    xmlFAParseRegExp(ctxt, 1);
    if (CUR != 0) {
	ERROR("xmlFAParseRegExp: extra characters");
    }
    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->end = ctxt->state;
    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->end->type = XML_REGEXP_FINAL_STATE;

    /* remove the Epsilon except for counted transitions */
    xmlFAEliminateEpsilonTransitions(ctxt);


    if (ctxt->error != 0) {
	xmlRegFreeParserCtxt(ctxt);
	return(NULL);
    }
    ret = xmlRegEpxFromParse(ctxt);
    xmlRegFreeParserCtxt(ctxt);
    return(ret);
}